

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Promise<void> __thiscall
capnp::LocalCallContext::tailCall(LocalCallContext *this,Own<capnp::RequestHook> *request)

{
  PipelineHook *pPVar1;
  Own<capnp::RequestHook> *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar2;
  VoidPromiseAndPipeline result;
  VoidPromiseAndPipeline local_58;
  Pipeline local_38;
  
  directTailCall(&local_58,(LocalCallContext *)request,in_RDX);
  pPVar1 = local_58.pipeline.ptr;
  if (request[9].disposer != (Disposer *)0x0) {
    local_58.pipeline.ptr = (PipelineHook *)0x0;
    local_38.hook.disposer = local_58.pipeline.disposer;
    local_38.hook.ptr = pPVar1;
    local_38.ops.ptr = (PipelineOp *)0x0;
    local_38.ops.size_ = 0;
    local_38.ops.disposer = (ArrayDisposer *)0x0;
    (**(request[9].disposer)->_vptr_Disposer)();
    AnyPointer::Pipeline::~Pipeline(&local_38);
  }
  (this->super_CallContextHook)._vptr_CallContextHook =
       (_func_int **)local_58.promise.super_PromiseBase.node.disposer;
  (this->super_Refcounted).super_Disposer._vptr_Disposer =
       (_func_int **)local_58.promise.super_PromiseBase.node.ptr;
  local_58.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  ClientHook::VoidPromiseAndPipeline::~VoidPromiseAndPipeline(&local_58);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> tailCall(kj::Own<RequestHook>&& request) override {
    auto result = directTailCall(kj::mv(request));
    KJ_IF_MAYBE(f, tailCallPipelineFulfiller) {
      f->get()->fulfill(AnyPointer::Pipeline(kj::mv(result.pipeline)));
    }
    return kj::mv(result.promise);
  }